

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

void trial::protocol::serialization::
     load_overloader<trial::protocol::bintoken::iarchive,_std::array<signed_char,_4UL>,_void>::load
               (iarchive *ar,array<signed_char,_4UL> *data,uint param_3)

{
  value vVar1;
  size_type size;
  error *peVar2;
  pointer data_00;
  size_type length;
  uint param_2_local;
  array<signed_char,_4UL> *data_local;
  iarchive *ar_local;
  
  vVar1 = bintoken::iarchive::code(ar);
  if ((((vVar1 != array8_int8) && (vVar1 != array16_int8)) && (vVar1 != array32_int8)) &&
     (vVar1 != array64_int8)) {
    peVar2 = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(peVar2,incompatible_type);
    __cxa_throw(peVar2,&bintoken::error::typeinfo,bintoken::error::~error);
  }
  size = bintoken::iarchive::length(ar);
  if (size < 5) {
    data_00 = std::array<signed_char,_4UL>::data(data);
    bintoken::iarchive::load_array<signed_char>(ar,data_00,size);
    return;
  }
  peVar2 = (error *)__cxa_allocate_exception(0x20);
  bintoken::error::error(peVar2,overflow);
  __cxa_throw(peVar2,&bintoken::error::typeinfo,bintoken::error::~error);
}

Assistant:

static void load(bintoken::iarchive& ar,
                     std::array<std::int8_t, N>& data,
                     const unsigned int /* protocol_version */)
    {
        switch (ar.code())
        {
        case bintoken::token::code::array8_int8:
        case bintoken::token::code::array16_int8:
        case bintoken::token::code::array32_int8:
        case bintoken::token::code::array64_int8:
            {
                const auto length = ar.length();
                if (length > N)
                {
                    throw bintoken::error(bintoken::overflow);
                }
                ar.load_array(data.data(), length);
            }
            break;

        default:
            throw bintoken::error(bintoken::incompatible_type);
        }
    }